

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

void PrintGraph(ExpressionGraphContext *ctx,ExprBase *expression,InplaceStr name)

{
  undefined8 uVar1;
  _func_int *p_Var2;
  long lVar3;
  ExprBase *pEVar4;
  SynBase *pSVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  char *str;
  char *pcVar9;
  TypeBase *pTVar10;
  OutputContext *this;
  char *pcVar11;
  char *node;
  _func_int **pp_Var12;
  ulong uVar13;
  _func_int *p_Var14;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr name_05;
  InplaceStr name_06;
  InplaceStr name_07;
  InplaceStr name_08;
  InplaceStr name_09;
  InplaceStr name_10;
  InplaceStr name_11;
  InplaceStr name_12;
  InplaceStr name_13;
  InplaceStr name_14;
  InplaceStr name_15;
  
  pcVar9 = name.end;
  str = name.begin;
  if (0x400 < ctx->depth) {
    pcVar11 = "{...}";
    goto LAB_00152761;
  }
  if (expression == (ExprBase *)0x0) {
    PrintIndent(ctx);
    OutputContext::Print(ctx->output,str,(int)name.end - (int)name.begin);
    this = ctx->output;
    pcVar9 = ": null\n";
    uVar8 = 7;
LAB_00152845:
    OutputContext::Print(this,pcVar9,uVar8);
    return;
  }
  switch(expression->typeID) {
  case 0:
    if (expression[1].typeID != 0) {
      PrintEnterBlock(ctx,expression,(ExprBase *)"ExprError()",str,pcVar9);
      if (expression[1].typeID != 0) {
        uVar13 = 0;
        do {
          PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase[uVar13],"");
          uVar13 = uVar13 + 1;
        } while (uVar13 < expression[1].typeID);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      this = ctx->output;
      pcVar9 = "}\n";
      uVar8 = 2;
      goto LAB_00152845;
    }
    pcVar11 = "ExprError()";
    goto LAB_00152761;
  case 1:
    pp_Var12 = (_func_int **)expression[1]._vptr_ExprBase[2];
    uVar13 = (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase + 3) - (int)pp_Var12);
    pcVar11 = "ExprErrorTypeMemberAccess(%.*s)";
    goto LAB_00153361;
  case 2:
    pcVar11 = "ExprVoid()";
    goto LAB_00152761;
  case 3:
    pp_Var12 = (_func_int **)0x1f6200;
    if (expression->field_0x29 != '\0') {
      pp_Var12 = (_func_int **)0x204c25;
    }
    pcVar11 = "ExprBoolLiteral(%s)";
    goto LAB_00153133;
  case 4:
    if ((char)expression->field_0x29 < ' ') {
      pcVar11 = "ExprCharacterLiteral(0x%02x)";
    }
    else {
      pcVar11 = "ExprCharacterLiteral(\'%c\')";
    }
    PrintIndented(ctx,expression,(ExprBase *)pcVar11,str,pcVar9);
    return;
  case 5:
    uVar13 = (ulong)expression[1].typeID;
    pcVar11 = "ExprStringLiteral(\'%.*s\')";
    pp_Var12 = expression[1]._vptr_ExprBase;
    goto LAB_00153361;
  case 6:
    pp_Var12 = expression[1]._vptr_ExprBase;
    pcVar11 = "ExprIntegerLiteral(%lld)";
LAB_00153133:
    PrintIndented(ctx,expression,(ExprBase *)pcVar11,str,pcVar9,pp_Var12);
    return;
  case 7:
    PrintIndented(ctx,expression,(ExprBase *)"ExprRationalLiteral(%f)",
                  (char *)expression[1]._vptr_ExprBase,str,pcVar9);
    return;
  case 8:
    pp_Var12 = (_func_int **)expression[1]._vptr_ExprBase[2];
    uVar13 = (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase + 3) - (int)pp_Var12);
    pcVar11 = "ExprTypeLiteral(%.*s)";
    goto LAB_00153361;
  case 9:
    pcVar11 = "ExprNullptrLiteral()";
LAB_00152761:
    PrintIndented(ctx,expression,(ExprBase *)pcVar11,str,pcVar9);
    return;
  case 10:
    pp_Var12 = *(_func_int ***)(expression[1]._vptr_ExprBase[7] + 0x40);
    uVar13 = (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase[7] + 0x48) - (int)pp_Var12);
    pcVar11 = "ExprFunctionIndexLiteral(%.*s: f%04x)";
    goto LAB_00153361;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                  ,0x3de,"void PrintGraph(ExpressionGraphContext &, ExprBase *, InplaceStr)");
  case 0xe:
    pcVar11 = "ExprPassthrough()";
    goto LAB_00153850;
  case 0xf:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprArray()",str,pcVar9);
    for (pEVar4 = (ExprBase *)expression[1]._vptr_ExprBase; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    goto LAB_00153876;
  case 0x10:
    pcVar11 = "))--";
    if ((char)expression[1].typeID != '\0') {
      pcVar11 = "))++";
    }
    pcVar11 = pcVar11 + 2;
    node = "ExprPreModify(%s)";
    goto LAB_00152e68;
  case 0x11:
    pcVar11 = "))--";
    if ((char)expression[1].typeID != '\0') {
      pcVar11 = "))++";
    }
    pcVar11 = pcVar11 + 2;
    node = "ExprPostModify(%s)";
    goto LAB_00152e68;
  case 0x12:
    if (0xd < (ulong)expression[1].typeID) {
      __assert_fail("!\"unknown category\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                    ,0x204,"void PrintGraph(ExpressionGraphContext &, ExprBase *, InplaceStr)");
    }
    pcVar11 = &DAT_001f4ab8 + *(int *)(&DAT_001f4ab8 + (ulong)expression[1].typeID * 4);
    node = "ExprTypeCast(%s)";
    goto LAB_00152e68;
  case 0x13:
    pcVar11 = GetOpName(*(SynUnaryOpType *)&expression->field_0x2c);
    node = "ExprUnaryOp(%s)";
LAB_00152e68:
    PrintEnterBlock(ctx,expression,(ExprBase *)node,str,pcVar9,pcVar11);
LAB_00153863:
    pTVar10 = (TypeBase *)expression[1]._vptr_ExprBase;
    pcVar9 = "value";
    break;
  case 0x14:
    pcVar11 = GetOpName(*(SynBinaryOpType *)&expression->field_0x2c);
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprBinaryOp(%s)",str,pcVar9,pcVar11);
    goto LAB_00153229;
  case 0x15:
    pp_Var12 = *(_func_int ***)(*(long *)(expression[1]._vptr_ExprBase[1] + 0x28) + 0x40);
    uVar13 = (ulong)(uint)(*(int *)(*(long *)(expression[1]._vptr_ExprBase[1] + 0x28) + 0x48) -
                          (int)pp_Var12);
    pcVar11 = "ExprGetAddress(%.*s: v%04x)";
    goto LAB_00153361;
  case 0x16:
    pcVar11 = "ExprDereference()";
    goto LAB_00153850;
  case 0x17:
    pcVar11 = "ExprUnboxing()";
LAB_00153850:
    PrintEnterBlock(ctx,expression,(ExprBase *)pcVar11,str,pcVar9);
    goto LAB_00153863;
  case 0x18:
    pcVar11 = "ExprConditional()";
    goto LAB_0015337c;
  case 0x19:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprAssignment()",str,pcVar9);
LAB_00153229:
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"lhs");
    pTVar10 = *(TypeBase **)&expression[1].typeID;
    pcVar9 = "rhs";
    break;
  case 0x1a:
    if (*(long *)&expression[1].typeID == 0) {
      pcVar11 = "ExprMemberAccess(%%missing%%)";
      goto LAB_00153850;
    }
    lVar6 = *(long *)(*(long *)&expression[1].typeID + 8);
    lVar3 = *(long *)(lVar6 + 0x28);
    uVar7 = *(undefined8 *)(lVar3 + 0x40);
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprMemberAccess(%.*s: v%04x)",str,pcVar9,
                    (ulong)(uint)(*(int *)(lVar3 + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(lVar6 + 0x40));
    goto LAB_00153863;
  case 0x1b:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprArrayIndex()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"value");
    pTVar10 = *(TypeBase **)&expression[1].typeID;
    pcVar9 = "index";
    break;
  case 0x1c:
    pcVar11 = "ExprReturn()";
    goto LAB_001532ee;
  case 0x1d:
    pcVar11 = "ExprYield()";
LAB_001532ee:
    PrintEnterBlock(ctx,expression,(ExprBase *)pcVar11,str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"value");
    PrintGraph(ctx,*(ExprBase **)&expression[1].typeID,"coroutineStateUpdate");
LAB_00153327:
    pTVar10 = (TypeBase *)expression[1].source;
LAB_0015332b:
    pcVar9 = "closures";
    break;
  case 0x1e:
    p_Var14 = expression[1]._vptr_ExprBase[1];
    uVar7 = *(undefined8 *)(*(long *)(p_Var14 + 0x20) + 0x10);
    uVar1 = *(undefined8 *)(*(long *)(p_Var14 + 0x28) + 0x40);
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprVariableDefinition(%.*s %.*s: v%04x)",str,pcVar9
                    ,(ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x20) + 0x18) - (int)uVar7),uVar7,
                    (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x28) + 0x48) - (int)uVar1),uVar1,
                    (ulong)*(uint *)(p_Var14 + 0x40));
    goto LAB_0015329a;
  case 0x1f:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprZeroInitialize()",str,pcVar9);
    pTVar10 = (TypeBase *)expression[1]._vptr_ExprBase;
    pcVar9 = "address";
    break;
  case 0x20:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprArraySetup()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"lhs");
LAB_0015329a:
    pTVar10 = *(TypeBase **)&expression[1].typeID;
    pcVar9 = "initializer";
    break;
  case 0x21:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprVariableDefinitions()",str,pcVar9);
    for (pEVar4 = *(ExprBase **)&expression[1].typeID; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    goto LAB_00153876;
  case 0x22:
    pp_Var12 = *(_func_int ***)(expression[1]._vptr_ExprBase[5] + 0x40);
    uVar13 = (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase[5] + 0x48) - (int)pp_Var12);
    pcVar11 = "ExprVariableAccess(%.*s: v%04x)";
    goto LAB_00153361;
  case 0x23:
    pp_Var12 = *(_func_int ***)(expression[1]._vptr_ExprBase[7] + 0x40);
    uVar13 = (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase[7] + 0x48) - (int)pp_Var12);
    pcVar11 = "ExprFunctionContextAccess(%.*s: f%04x)";
    goto LAB_00153361;
  case 0x24:
    pp_Var12 = expression[1]._vptr_ExprBase;
    if (ctx->skipFunctionDefinitions == true) {
      pcVar11 = "";
      if (*(char *)(pp_Var12 + 0x29) != '\0') {
        pcVar11 = "prototype, ";
      }
      uVar7 = *(undefined8 *)(pp_Var12[7] + 0x40);
      PrintIndented(ctx,expression,(ExprBase *)"ExprFunctionDefinition(%s%.*s: f%04x);",str,pcVar9,
                    pcVar11,(ulong)(uint)(*(int *)(pp_Var12[7] + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(pp_Var12 + 0xb));
      return;
    }
    if (*(char *)(pp_Var12 + 0x29) == '\0') {
      ctx->skipFunctionDefinitions = true;
      uVar7 = *(undefined8 *)(pp_Var12[7] + 0x40);
      PrintEnterBlock(ctx,expression,(ExprBase *)"ExprFunctionDefinition(%s%.*s: f%04x)",str,pcVar9,
                      "",(ulong)(uint)(*(int *)(pp_Var12[7] + 0x48) - (int)uVar7),uVar7,
                      (ulong)*(uint *)(pp_Var12 + 0xb));
      PrintGraph(ctx,*(ExprBase **)&expression[1].typeID,"contextArgument");
      name_14.end = "";
      name_14.begin = "arguments";
      PrintEnterBlock(ctx,name_14,(TypeBase *)0x0);
      for (pSVar5 = expression[1].source; pSVar5 != (SynBase *)0x0;
          pSVar5 = (SynBase *)(pSVar5->pos).begin) {
        PrintGraph(ctx,(ExprBase *)pSVar5,"");
      }
      PrintLeaveBlock(ctx);
      PrintGraph(ctx,expression[1].next,"coroutineStateRead");
      name_15.end = "";
      name_15.begin = "expressions";
      PrintEnterBlock(ctx,name_15,(TypeBase *)0x0);
      for (pEVar4 = *(ExprBase **)&expression[1].listed; pEVar4 != (ExprBase *)0x0;
          pEVar4 = pEVar4->next) {
        PrintGraph(ctx,pEVar4,"");
      }
      PrintLeaveBlock(ctx);
      PrintLeaveBlock(ctx);
      ctx->skipFunctionDefinitions = false;
      return;
    }
    uVar7 = *(undefined8 *)(pp_Var12[7] + 0x40);
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprFunctionDefinition(%s%.*s: f%04x)",str,pcVar9,
                    "prototype, ",(ulong)(uint)(*(int *)(pp_Var12[7] + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(pp_Var12 + 0xb));
    p_Var14 = expression[1]._vptr_ExprBase[0x2a];
    if (p_Var14 != (_func_int *)0x0) {
      uVar7 = *(undefined8 *)(*(long *)(p_Var14 + 0x38) + 0x40);
      PrintIndented(ctx,*(undefined8 *)(p_Var14 + 0x28),(TypeBase *)"%.*s: f%04x","implementation",
                    "",(ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x38) + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(p_Var14 + 0x58));
    }
    goto LAB_00153876;
  case 0x25:
    p_Var14 = expression[1]._vptr_ExprBase[7];
    uVar7 = *(undefined8 *)(p_Var14 + 0x40);
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprGenericFunctionPrototype(%.*s: f%04x)",str,
                    pcVar9,(ulong)(uint)(*(int *)(p_Var14 + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(expression[1]._vptr_ExprBase + 0xb));
    name_01.end = "";
    name_01.begin = "contextVariables";
    PrintEnterBlock(ctx,name_01,(TypeBase *)0x0);
    for (pEVar4 = *(ExprBase **)&expression[1].typeID; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    goto LAB_00153563;
  case 0x26:
    p_Var14 = expression[1]._vptr_ExprBase[7];
    uVar7 = *(undefined8 *)(p_Var14 + 0x40);
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprFunctionAccess(%.*s: f%04x)",str,pcVar9,
                    (ulong)(uint)(*(int *)(p_Var14 + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(expression[1]._vptr_ExprBase + 0xb));
    pTVar10 = *(TypeBase **)&expression[1].typeID;
    goto LAB_00152b76;
  case 0x27:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprFunctionOverloadSet()",str,pcVar9);
    name_02.end = "";
    name_02.begin = "functions";
    PrintEnterBlock(ctx,name_02,(TypeBase *)0x0);
    for (pp_Var12 = expression[1]._vptr_ExprBase; pp_Var12 != (_func_int **)0x0;
        pp_Var12 = (_func_int **)pp_Var12[1]) {
      p_Var14 = *pp_Var12;
      uVar7 = *(undefined8 *)(*(long *)(p_Var14 + 0x38) + 0x40);
      PrintIndented(ctx,*(undefined8 *)(p_Var14 + 0x28),(TypeBase *)"%.*s: f%04x",str,pcVar9,
                    (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x38) + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(p_Var14 + 0x58));
    }
    PrintLeaveBlock(ctx);
    pTVar10 = (TypeBase *)expression[1].source;
LAB_00152b76:
    pcVar9 = "context";
    break;
  case 0x28:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprShortFunctionOverloadSet()",str,pcVar9);
    name_03.end = "";
    name_03.begin = "functions";
    PrintEnterBlock(ctx,name_03,(TypeBase *)0x0);
    for (pp_Var12 = expression[1]._vptr_ExprBase; pp_Var12 != (_func_int **)0x0;
        pp_Var12 = (_func_int **)pp_Var12[2]) {
      p_Var14 = *pp_Var12;
      uVar7 = *(undefined8 *)(*(long *)(p_Var14 + 0x38) + 0x40);
      PrintIndented(ctx,*(undefined8 *)(p_Var14 + 0x28),(TypeBase *)"%.*s: f%04x",str,pcVar9,
                    (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x38) + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(p_Var14 + 0x58));
      PrintGraph(ctx,(ExprBase *)pp_Var12[1],"context");
    }
    goto LAB_00153563;
  case 0x29:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprFunctionCall()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"function");
    name_00.end = "";
    name_00.begin = "arguments";
    PrintEnterBlock(ctx,name_00,(TypeBase *)0x0);
    for (pEVar4 = *(ExprBase **)&expression[1].typeID; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    goto LAB_00153563;
  case 0x2a:
    pp_Var12 = expression[1]._vptr_ExprBase;
    uVar7 = *(undefined8 *)(pp_Var12[3] + 0x10);
    uVar1 = *(undefined8 *)(pp_Var12[4] + 0x40);
    PrintIndented(ctx,expression,(ExprBase *)"ExprAliasDefinition(%.*s %.*s: a%04x)",str,pcVar9,
                  (ulong)(uint)(*(int *)(pp_Var12[3] + 0x18) - (int)uVar7),uVar7,
                  (ulong)(uint)(*(int *)(pp_Var12[4] + 0x48) - (int)uVar1),uVar1,
                  (ulong)*(uint *)((long)pp_Var12 + 0x2c));
    return;
  case 0x2b:
    pp_Var12 = (_func_int **)expression[1]._vptr_ExprBase[2];
    uVar13 = (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase + 3) - (int)pp_Var12);
    pcVar11 = "ExprClassPrototype(%.*s)";
LAB_00153361:
    PrintIndented(ctx,expression,(ExprBase *)pcVar11,str,pcVar9,uVar13,pp_Var12);
    return;
  case 0x2c:
    p_Var14 = expression[1]._vptr_ExprBase[2];
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprGenericClassPrototype(%.*s)",str,pcVar9,
                    (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase + 3) - (int)p_Var14),p_Var14
                   );
    name_08.end = "";
    name_08.begin = "instances";
    PrintEnterBlock(ctx,name_08,(TypeBase *)0x0);
    for (pEVar4 = (ExprBase *)expression[1]._vptr_ExprBase[0x19]; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    goto LAB_00153563;
  case 0x2d:
    pp_Var12 = expression[1]._vptr_ExprBase;
    p_Var14 = pp_Var12[0x23];
    p_Var2 = pp_Var12[2];
    uVar13 = (ulong)(uint)(*(int *)(pp_Var12 + 3) - (int)p_Var2);
    if (p_Var14 == (_func_int *)0x0) {
      pcVar11 = "\t";
      if (*(char *)(pp_Var12 + 0x22) != '\0') {
        pcVar11 = ", extendable";
      }
      PrintEnterBlock(ctx,expression,(ExprBase *)"ExprClassDefinition(%.*s%s)",str,pcVar9,uVar13,
                      p_Var2,pcVar11 + 1);
    }
    else {
      PrintEnterBlock(ctx,expression,(ExprBase *)"ExprClassDefinition(%.*s: %.*s)",str,pcVar9,uVar13
                      ,p_Var2,(ulong)(uint)(*(int *)(p_Var14 + 0x18) -
                                           (int)*(undefined8 *)(p_Var14 + 0x10)),
                      *(undefined8 *)(p_Var14 + 0x10));
    }
    name_11.end = "";
    name_11.begin = "variables";
    PrintEnterBlock(ctx,name_11,(TypeBase *)0x0);
    for (p_Var14 = expression[1]._vptr_ExprBase[0xd]; p_Var14 != (_func_int *)0x0;
        p_Var14 = *(_func_int **)(p_Var14 + 0x18)) {
      lVar6 = *(long *)(p_Var14 + 8);
      uVar7 = *(undefined8 *)(*(long *)(lVar6 + 0x28) + 0x40);
      PrintIndented(ctx,*(undefined8 *)(lVar6 + 0x20),(TypeBase *)"%.*s: v%04x @ 0x%x",(char *)0x0,0
                    ,(ulong)(uint)(*(int *)(*(long *)(lVar6 + 0x28) + 0x48) - (int)uVar7),uVar7,
                    (ulong)*(uint *)(lVar6 + 0x40),(ulong)*(uint *)(lVar6 + 0x3c));
    }
    PrintLeaveBlock(ctx);
    name_12.end = "";
    name_12.begin = "functions";
    PrintEnterBlock(ctx,name_12,(TypeBase *)0x0);
    for (pTVar10 = expression[1].type; pTVar10 != (TypeBase *)0x0;
        pTVar10 = (TypeBase *)pTVar10->importModule) {
      PrintGraph(ctx,(ExprBase *)pTVar10,"");
    }
    PrintLeaveBlock(ctx);
    name_13.end = "";
    name_13.begin = "constants";
    PrintEnterBlock(ctx,name_13,(TypeBase *)0x0);
    for (p_Var14 = expression[1]._vptr_ExprBase[0xf]; p_Var14 != (_func_int *)0x0;
        p_Var14 = *(_func_int **)(p_Var14 + 0x10)) {
      PrintGraph(ctx,*(ExprBase **)(p_Var14 + 8),*(InplaceStr *)(*(long *)p_Var14 + 0x40));
    }
    goto LAB_00153563;
  case 0x2e:
    p_Var14 = expression[1]._vptr_ExprBase[2];
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprEnumDefinition(%.*s)",str,pcVar9,
                    (ulong)(uint)(*(int *)(expression[1]._vptr_ExprBase + 3) - (int)p_Var14),p_Var14
                   );
    name_04.end = "";
    name_04.begin = "constants";
    PrintEnterBlock(ctx,name_04,(TypeBase *)0x0);
    for (p_Var14 = expression[1]._vptr_ExprBase[0xf]; p_Var14 != (_func_int *)0x0;
        p_Var14 = *(_func_int **)(p_Var14 + 0x10)) {
      PrintGraph(ctx,*(ExprBase **)(p_Var14 + 8),*(InplaceStr *)(*(long *)p_Var14 + 0x40));
    }
    PrintLeaveBlock(ctx);
    PrintGraph(ctx,*(ExprBase **)&expression[1].typeID,"toInt");
    pTVar10 = (TypeBase *)expression[1].source;
    pcVar9 = "toEnum";
    break;
  case 0x2f:
    pcVar11 = "ExprIfElse()";
LAB_0015337c:
    PrintEnterBlock(ctx,expression,(ExprBase *)pcVar11,str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"condition");
    PrintGraph(ctx,*(ExprBase **)&expression[1].typeID,"trueBlock");
    pTVar10 = (TypeBase *)expression[1].source;
    pcVar9 = "falseBlock";
    break;
  case 0x30:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprFor()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"initializer");
    PrintGraph(ctx,*(ExprBase **)&expression[1].typeID,"condition");
    PrintGraph(ctx,(ExprBase *)expression[1].source,"increment");
    pTVar10 = expression[1].type;
    goto LAB_00152d9a;
  case 0x31:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprWhile()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"condition");
    pTVar10 = *(TypeBase **)&expression[1].typeID;
LAB_00152d9a:
    pcVar9 = "body";
    break;
  case 0x32:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprDoWhile()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"body");
    pTVar10 = *(TypeBase **)&expression[1].typeID;
    pcVar9 = "condition";
    break;
  case 0x33:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprSwitch()",str,pcVar9);
    PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase,"condition");
    name_09.end = "";
    name_09.begin = "cases";
    PrintEnterBlock(ctx,name_09,(TypeBase *)0x0);
    for (pEVar4 = *(ExprBase **)&expression[1].typeID; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    PrintLeaveBlock(ctx);
    name_10.end = "";
    name_10.begin = "blocks";
    PrintEnterBlock(ctx,name_10,(TypeBase *)0x0);
    for (pTVar10 = expression[1].type; pTVar10 != (TypeBase *)0x0;
        pTVar10 = (TypeBase *)pTVar10->importModule) {
      PrintGraph(ctx,(ExprBase *)pTVar10,"");
    }
    PrintLeaveBlock(ctx);
    pTVar10 = *(TypeBase **)&expression[1].listed;
    pcVar9 = "defaultBlock";
    break;
  case 0x34:
    uVar8 = *(uint *)&expression->field_0x2c;
    pcVar11 = "ExprBreak(%d)";
    goto LAB_0015317f;
  case 0x35:
    uVar8 = *(uint *)&expression->field_0x2c;
    pcVar11 = "ExprContinue(%d)";
LAB_0015317f:
    PrintEnterBlock(ctx,expression,(ExprBase *)pcVar11,str,pcVar9,(ulong)uVar8);
    pTVar10 = (TypeBase *)expression[1]._vptr_ExprBase;
    goto LAB_0015332b;
  case 0x36:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprBlock()",str,pcVar9);
    for (pEVar4 = (ExprBase *)expression[1]._vptr_ExprBase; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    goto LAB_00153327;
  case 0x37:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprSequence()",str,pcVar9);
    if (expression[1].typeID != 0) {
      uVar13 = 0;
      do {
        PrintGraph(ctx,(ExprBase *)expression[1]._vptr_ExprBase[uVar13],"");
        uVar13 = uVar13 + 1;
      } while (uVar13 < expression[1].typeID);
    }
    goto LAB_00153876;
  case 0x38:
    PrintEnterBlock(ctx,expression,(ExprBase *)"ExprModule()",str,pcVar9);
    if (ctx->skipImported == false) {
      PrintGraph(ctx,(ScopeData *)expression[1]._vptr_ExprBase,true);
    }
    PrintGraph(ctx,(ScopeData *)expression[1]._vptr_ExprBase,false);
    name_05.end = "";
    name_05.begin = "definitions";
    PrintEnterBlock(ctx,name_05,(TypeBase *)0x0);
    if (*(int *)&expression[1].source != 0) {
      uVar13 = 0;
      do {
        PrintGraph(ctx,*(ExprBase **)(*(long *)&expression[1].typeID + uVar13 * 8),"");
        uVar13 = uVar13 + 1;
      } while (uVar13 < *(uint *)&expression[1].source);
    }
    PrintLeaveBlock(ctx);
    ctx->skipFunctionDefinitions = true;
    name_06.end = "";
    name_06.begin = "setup";
    PrintEnterBlock(ctx,name_06,(TypeBase *)0x0);
    for (pEVar4 = (ExprBase *)expression[7]._vptr_ExprBase; pEVar4 != (ExprBase *)0x0;
        pEVar4 = pEVar4->next) {
      PrintGraph(ctx,pEVar4,"");
    }
    PrintLeaveBlock(ctx);
    name_07.end = "";
    name_07.begin = "expressions";
    PrintEnterBlock(ctx,name_07,(TypeBase *)0x0);
    for (pSVar5 = expression[7].source; pSVar5 != (SynBase *)0x0;
        pSVar5 = (SynBase *)(pSVar5->pos).begin) {
      PrintGraph(ctx,(ExprBase *)pSVar5,"");
    }
LAB_00153563:
    PrintLeaveBlock(ctx);
    goto LAB_00153876;
  }
  PrintGraph(ctx,(ExprBase *)pTVar10,pcVar9);
LAB_00153876:
  PrintLeaveBlock(ctx);
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ExprBase *expression, InplaceStr name)
{
	if(ctx.depth > 1024)
	{
		PrintIndented(ctx, name, expression, "{...}");
		return;
	}

	if(ExprError *node = getType<ExprError>(expression))
	{
		if(!node->values.empty())
		{
			PrintEnterBlock(ctx, name, node, "ExprError()");

			for(unsigned i = 0; i < node->values.size(); i++)
				PrintGraph(ctx, node->values[i], "");

			PrintLeaveBlock(ctx);
		}
		else
		{
			PrintIndented(ctx, name, node, "ExprError()");
		}
	}
	else if(ExprErrorTypeMemberAccess *node = getType<ExprErrorTypeMemberAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprErrorTypeMemberAccess(%.*s)", FMT_ISTR(node->value->name));
	}
	else if(ExprVoid *node = getType<ExprVoid>(expression))
	{
		PrintIndented(ctx, name, node, "ExprVoid()");
	}
	else if(ExprBoolLiteral *node = getType<ExprBoolLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprBoolLiteral(%s)", node->value ? "true" : "false");
	}
	else if(ExprCharacterLiteral *node = getType<ExprCharacterLiteral>(expression))
	{
		if((int)node->value < (int)' ')
			PrintIndented(ctx, name, node, "ExprCharacterLiteral(0x%02x)", node->value);
		else
			PrintIndented(ctx, name, node, "ExprCharacterLiteral(\'%c\')", node->value);
	}
	else if(ExprStringLiteral *node = getType<ExprStringLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprStringLiteral(\'%.*s\')", node->length, node->value);
	}
	else if(ExprIntegerLiteral *node = getType<ExprIntegerLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprIntegerLiteral(%lld)", node->value);
	}
	else if(ExprRationalLiteral *node = getType<ExprRationalLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprRationalLiteral(%f)", node->value);
	}
	else if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprTypeLiteral(%.*s)", FMT_ISTR(node->value->name));
	}
	else if(ExprNullptrLiteral *node = getType<ExprNullptrLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprNullptrLiteral()");
	}
	else if(ExprFunctionIndexLiteral *node = getType<ExprFunctionIndexLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprFunctionIndexLiteral(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPassthrough()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArray()");

		for(ExprBase *value = node->values.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPreModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPostModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		const char *category = "";

		switch(node->category)
		{
		case EXPR_CAST_NUMERICAL:
			category = "EXPR_CAST_NUMERICAL";
			break;
		case EXPR_CAST_PTR_TO_BOOL:
			category = "EXPR_CAST_PTR_TO_BOOL";
			break;
		case EXPR_CAST_UNSIZED_TO_BOOL:
			category = "EXPR_CAST_UNSIZED_TO_BOOL";
			break;
		case EXPR_CAST_FUNCTION_TO_BOOL:
			category = "EXPR_CAST_FUNCTION_TO_BOOL";
			break;
		case EXPR_CAST_NULL_TO_PTR:
			category = "EXPR_CAST_NULL_TO_PTR";
			break;
		case EXPR_CAST_NULL_TO_AUTO_PTR:
			category = "EXPR_CAST_NULL_TO_AUTO_PTR";
			break;
		case EXPR_CAST_NULL_TO_UNSIZED:
			category = "EXPR_CAST_NULL_TO_UNSIZED";
			break;
		case EXPR_CAST_NULL_TO_AUTO_ARRAY:
			category = "EXPR_CAST_NULL_TO_AUTO_ARRAY";
			break;
		case EXPR_CAST_NULL_TO_FUNCTION:
			category = "EXPR_CAST_NULL_TO_FUNCTION";
			break;
		case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
			category = "EXPR_CAST_ARRAY_PTR_TO_UNSIZED";
			break;
		case EXPR_CAST_PTR_TO_AUTO_PTR:
			category = "EXPR_CAST_PTR_TO_AUTO_PTR";
			break;
		case EXPR_CAST_AUTO_PTR_TO_PTR:
			category = "EXPR_CAST_AUTO_PTR_TO_PTR";
			break;
		case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
			category = "EXPR_CAST_UNSIZED_TO_AUTO_ARRAY";
			break;
		case EXPR_CAST_REINTERPRET:
			category = "EXPR_CAST_REINTERPRET";
			break;
		default:
			assert(!"unknown category");
		}

		PrintEnterBlock(ctx, name, node, "ExprTypeCast(%s)", category);

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprUnaryOp(%s)", GetOpName(node->op));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBinaryOp(%s)", GetOpName(node->op));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(ExprGetAddress *node = getType<ExprGetAddress>(expression))
	{
		PrintIndented(ctx, name, node, "ExprGetAddress(%.*s: v%04x)", FMT_ISTR(node->variable->variable->name->name), node->variable->variable->uniqueId);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprDereference()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprUnboxing()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprConditional()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprAssignment()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		if(node->member)
			PrintEnterBlock(ctx, name, node, "ExprMemberAccess(%.*s: v%04x)", FMT_ISTR(node->member->variable->name->name), node->member->variable->uniqueId);
		else
			PrintEnterBlock(ctx, name, node, "ExprMemberAccess(%%missing%%)");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArrayIndex()");

		PrintGraph(ctx, node->value, "value");
		PrintGraph(ctx, node->index, "index");

		PrintLeaveBlock(ctx);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprReturn()");

		PrintGraph(ctx, node->value, "value");

		PrintGraph(ctx, node->coroutineStateUpdate, "coroutineStateUpdate");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprYield()");

		PrintGraph(ctx, node->value, "value");

		PrintGraph(ctx, node->coroutineStateUpdate, "coroutineStateUpdate");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprVariableDefinition(%.*s %.*s: v%04x)", FMT_ISTR(node->variable->variable->type->name), FMT_ISTR(node->variable->variable->name->name), node->variable->variable->uniqueId);

		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprZeroInitialize()");

		PrintGraph(ctx, node->address, "address");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArraySetup()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprVariableDefinitions()");

		for(ExprBase *value = node->definitions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprVariableAccess(%.*s: v%04x)", FMT_ISTR(node->variable->name->name), node->variable->uniqueId);
	}
	else if(ExprFunctionContextAccess *node = getType<ExprFunctionContextAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprFunctionContextAccess(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		if(ctx.skipFunctionDefinitions)
		{
			PrintIndented(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x);", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);
			return;
		}

		if(node->function->isPrototype)
		{
			PrintEnterBlock(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x)", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);
			
			if(FunctionData *implementation = node->function->implementation)
				PrintIndented(ctx, InplaceStr("implementation"), implementation->type, "%.*s: f%04x", FMT_ISTR(implementation->name->name), implementation->uniqueId);

			PrintLeaveBlock(ctx);

			return;
		}

		ctx.skipFunctionDefinitions = true;

		PrintEnterBlock(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x)", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintGraph(ctx, node->contextArgument, "contextArgument");

		PrintEnterBlock(ctx, InplaceStr("arguments"), 0);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->coroutineStateRead, "coroutineStateRead");

		PrintEnterBlock(ctx, InplaceStr("expressions"), 0);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);

		ctx.skipFunctionDefinitions = false;
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprGenericFunctionPrototype(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintEnterBlock(ctx, InplaceStr("contextVariables"), 0);

		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionAccess(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintGraph(ctx, node->context, "context");

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionOverloadSet()");

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(FunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			PrintIndented(ctx, name, arg->function->type, "%.*s: f%04x", FMT_ISTR(arg->function->name->name), arg->function->uniqueId);

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->context, "context");

		PrintLeaveBlock(ctx);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprShortFunctionOverloadSet()");

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
		{
			PrintIndented(ctx, name, arg->function->type, "%.*s: f%04x", FMT_ISTR(arg->function->name->name), arg->function->uniqueId);

			PrintGraph(ctx, arg->context, "context");
		}

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionCall()");

		PrintGraph(ctx, node->function, "function");

		PrintEnterBlock(ctx, InplaceStr("arguments"), 0);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprAliasDefinition *node = getType<ExprAliasDefinition>(expression))
	{
		PrintIndented(ctx, name, node, "ExprAliasDefinition(%.*s %.*s: a%04x)", FMT_ISTR(node->alias->type->name), FMT_ISTR(node->alias->name->name), node->alias->uniqueId);
	}
	else if(ExprClassPrototype *node = getType<ExprClassPrototype>(expression))
	{
		PrintIndented(ctx, name, node, "ExprClassPrototype(%.*s)", FMT_ISTR(node->classType->name));
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprGenericClassPrototype(%.*s)", FMT_ISTR(node->genericProtoType->name));

		PrintEnterBlock(ctx, InplaceStr("instances"), 0);

		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		if(node->classType->baseClass)
			PrintEnterBlock(ctx, name, node, "ExprClassDefinition(%.*s: %.*s)", FMT_ISTR(node->classType->name), FMT_ISTR(node->classType->baseClass->name));
		else
			PrintEnterBlock(ctx, name, node, "ExprClassDefinition(%.*s%s)", FMT_ISTR(node->classType->name), node->classType->extendable ? " extendable" : "");

		PrintEnterBlock(ctx, InplaceStr("variables"), 0);

		for(MemberHandle *value = node->classType->members.head; value; value = value->next)
			PrintIndented(ctx, InplaceStr(), value->variable->type, "%.*s: v%04x @ 0x%x", FMT_ISTR(value->variable->name->name), value->variable->uniqueId, value->variable->offset);

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(ExprBase *value = node->functions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("constants"), 0);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			PrintGraph(ctx, value->value, value->name->name);

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprEnumDefinition(%.*s)", FMT_ISTR(node->enumType->name));

		PrintEnterBlock(ctx, InplaceStr("constants"), 0);

		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			PrintGraph(ctx, value->value, value->name->name);

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->toInt, "toInt");
		PrintGraph(ctx, node->toEnum, "toEnum");

		PrintLeaveBlock(ctx);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprIfElse()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFor()");

		PrintGraph(ctx, node->initializer, "initializer");
		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->increment, "increment");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprWhile()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprDoWhile()");

		PrintGraph(ctx, node->body, "body");
		PrintGraph(ctx, node->condition, "condition");

		PrintLeaveBlock(ctx);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprSwitch()");

		PrintGraph(ctx, node->condition, "condition");

		PrintEnterBlock(ctx, InplaceStr("cases"), 0);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("blocks"), 0);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->defaultBlock, "defaultBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBreak(%d)", node->depth);

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprContinue(%d)", node->depth);

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBlock()");

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprSequence()");

		for(unsigned i = 0; i < node->expressions.size(); i++)
			PrintGraph(ctx, node->expressions[i], "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprModule()");

		if(!ctx.skipImported)
			PrintGraph(ctx, node->moduleScope, true);

		PrintGraph(ctx, node->moduleScope, false);

		PrintEnterBlock(ctx, InplaceStr("definitions"), 0);

		for(unsigned i = 0; i < node->definitions.size(); i++)
			PrintGraph(ctx, node->definitions[i], "");

		PrintLeaveBlock(ctx);

		ctx.skipFunctionDefinitions = true;

		PrintEnterBlock(ctx, InplaceStr("setup"), 0);

		for(ExprBase *value = node->setup.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("expressions"), 0);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(!expression)
	{
		PrintIndent(ctx);

		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": null\n");
	}
	else
	{
		assert(!"unknown type");
	}
}